

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O2

rotation_t *
opengv::relative_pose::ge
          (rotation_t *__return_storage_ptr__,RelativeAdapterBase *adapter,Indices *indices,
          geOutput_t *output,bool useWeights)

{
  size_t sVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  long lVar14;
  size_t i_1;
  long lVar15;
  size_t i_2;
  int iVar16;
  size_t i;
  size_t sVar17;
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  double local_1048;
  MatrixXd Hcross;
  Vector3d pointsCenter2;
  Matrix<double,_1,_9,_1,_1,_9> f2_19;
  bearingVector_t f2;
  Vector3d t1;
  Vector3d t2;
  Vector3d pointsCenter1;
  rotation_t startingRotation;
  Matrix3d zxF;
  Matrix3d yzF;
  Matrix3d xyF;
  Matrix3d zzF;
  Matrix3d yyF;
  Matrix3d xxF;
  Matrix<double,_9,_9,_0,_9,_9> m11P;
  Matrix<double,_3,_9,_0,_3,_9> z2P;
  Matrix<double,_3,_9,_0,_3,_9> y2P;
  Matrix<double,_3,_9,_0,_3,_9> x2P;
  Matrix<double,_3,_9,_0,_3,_9> z1P;
  Matrix<double,_3,_9,_0,_3,_9> y1P;
  Matrix<double,_3,_9,_0,_3,_9> x1P;
  Matrix<double,_9,_9,_0,_9,_9> m22P;
  Matrix<double,_9,_9,_0,_9,_9> m12P;
  
  sVar1 = indices->_numberCorrespondences;
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&xxF,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&yyF,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&zzF,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&xyF,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&yzF,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&zxF,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>> *)&x1P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>> *)&y1P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>> *)&z1P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>> *)&x2P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>> *)&y2P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)&m11P);
  m11P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,9,0,3,9>> *)&z2P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)&m11P);
  m12P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,9,0,9,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,9,9,0,9,9>> *)&m11P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>_>
              *)&m12P);
  m22P.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,9,0,9,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,9,9,0,9,9>> *)&m12P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>_>
              *)&m22P);
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,9,9,0,9,9>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>>>
            ((PlainObjectBase<Eigen::Matrix<double,9,9,0,9,9>> *)&m22P,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>_>
              *)&startingRotation);
  auVar23 = ZEXT864(0) << 0x40;
  lVar15 = 0;
  for (sVar17 = 0; dVar21 = auVar23._0_8_, sVar1 != sVar17; sVar17 = sVar17 + 1) {
    if (indices->_useIndices == false) {
      iVar16 = (int)sVar17;
    }
    else {
      iVar16 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + (lVar15 >> 0x1e));
    }
    dVar20 = dVar21;
    (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar16);
    lVar15 = lVar15 + 0x100000000;
    auVar23 = ZEXT864((ulong)(dVar21 + dVar20 * dVar20));
  }
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    auVar2 = vsqrtsd_avx(auVar23._0_16_,auVar23._0_16_);
    dVar21 = auVar2._0_8_;
  }
  lVar15 = 0;
  sVar17 = 0;
  while( true ) {
    iVar16 = (int)sVar17;
    if (sVar1 == sVar17) break;
    dVar20 = 1.0;
    local_1048 = 1.0;
    lVar14 = lVar15 >> 0x1e;
    if (useWeights) {
      iVar13 = iVar16;
      if (indices->_useIndices != false) {
        iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar14);
      }
      (*adapter->_vptr_RelativeAdapterBase[4])(adapter,(long)iVar13);
      local_1048 = dVar20 / dVar21;
    }
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[6])
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&startingRotation,adapter,
               (long)iVar13);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[2])
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&f2_19,adapter,(long)iVar13);
    pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[1] = (double)&f2_19;
    pointsCenter1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
    array[0] = (double)&startingRotation;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&Hcross,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&pointsCenter1);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[8])
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&startingRotation,adapter,
               (long)iVar13);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[3])
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&f2_19,adapter,(long)iVar13);
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f2,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&pointsCenter1);
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1] =
         (double)&f2;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&f2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>>::
    _set_noalias<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&startingRotation,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&f2_19);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&xxF;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data * local_1048;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _40_24_ = auVar23._40_24_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[4] =
         (double)&startingRotation;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&xxF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&f2_19);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&yyF;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows * local_1048;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _40_24_ = auVar23._40_24_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&yyF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&f2_19);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&zzF;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols * local_1048;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _40_24_ = auVar23._40_24_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&zzF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&f2_19);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&xyF;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
         local_1048 *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _40_24_ = auVar23._40_24_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&xyF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&f2_19);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&yzF;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
         local_1048 *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _40_24_ = auVar23._40_24_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&yzF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&f2_19);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&zxF;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[3] =
         local_1048 *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_cols *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_data;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _40_24_ = auVar23._40_24_;
    Eigen::internal::
    call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,3,0,3,3>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const>>
              (&zxF,(CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                     *)&f2_19);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[5])(&t1,adapter,(long)iVar13);
    if (indices->_useIndices != false) {
      iVar16 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[7])(&t2,adapter,(long)iVar16);
    auVar22._8_8_ = 0;
    auVar22._0_8_ =
         Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
    auVar28._8_8_ =
         Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    auVar28._0_8_ =
         Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
    auVar25._8_8_ = 0;
    auVar25._0_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    auVar30._8_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    auVar30._0_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    auVar9._8_8_ = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                   .m_cols;
    auVar9._0_8_ = Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                   .m_rows;
    auVar11._8_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    auVar11._0_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    auVar10._8_8_ =
         f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    auVar10._0_8_ =
         f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    auVar12._8_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    auVar12._0_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    auVar2 = vunpcklpd_avx(auVar28,auVar22);
    auVar25 = vunpcklpd_avx(auVar30,auVar25);
    auVar29._0_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
         auVar2._0_8_;
    auVar29._8_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         auVar2._8_8_;
    auVar26._8_8_ = 0;
    auVar26._0_8_ =
         t1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         (double)Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                 m_rows;
    auVar3 = vfmsub231sd_fma(auVar26,auVar22,auVar11);
    auVar2 = vfmsub213pd_fma(auVar25,auVar9,auVar29);
    auVar23 = vbroadcastsd_avx512f(auVar3);
    vinsertf32x4_avx512f(ZEXT1664(auVar2),auVar2,1);
    auVar31._8_8_ = 0;
    auVar31._0_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    auVar23 = vpermt2pd_avx512f(_DAT_003ab9c0,auVar23);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
    auVar18 = vbroadcastsd_avx512f(auVar2);
    auVar2 = vunpcklpd_avx(auVar18._0_16_,auVar10);
    auVar32._8_8_ = 0;
    auVar32._0_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
         f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    auVar25 = vfmsub231sd_fma(auVar32,auVar10,auVar12);
    auVar19 = vpermt2pd_avx512f(_DAT_003aba00,auVar18);
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array._0_64_
         = vmulpd_avx512f(auVar23,auVar19);
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[8] =
         auVar18._0_8_ * auVar3._0_8_;
    auVar27._8_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    auVar27._0_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    auVar24._0_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] *
         auVar2._0_8_;
    auVar24._8_8_ =
         t2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
         auVar2._8_8_;
    auVar2 = vunpcklpd_avx(auVar27,auVar31);
    auVar3._8_8_ = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[2];
    auVar3._0_8_ = f2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array[1];
    auVar2 = vfmsub132pd_fma(auVar2,auVar24,auVar3);
    auVar23 = vpermt2pd_avx512f(_DAT_003aba40,ZEXT1664(auVar22));
    vinsertf32x4_avx512f(ZEXT1664(auVar2),auVar2,1);
    auVar18 = vbroadcastsd_avx512f(auVar25);
    auVar18 = vpermt2pd_avx512f(_DAT_003ab9c0,auVar18);
    _pointsCenter1 = vmulpd_avx512f(auVar23,auVar18);
    if (useWeights) {
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&x1P;
      in_ZMM5 = ZEXT1664(auVar28);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&y1P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&z1P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&x2P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&y2P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&z2P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&m11P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,9,0,9,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_9,_9,_0,_9,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&m22P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,9,0,9,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_9,_9,_0,_9,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&m12P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,9,0,9,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_9,_9,_0,_9,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
    }
    else {
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&x1P;
      in_ZMM5 = ZEXT1664(auVar28);
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&y1P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&z1P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&x2P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&y2P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&z2P;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,3,9,0,3,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,9,0,3,9>const,Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_3,_9,_0,_3,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&m11P;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (double)&pointsCenter1;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (double)&pointsCenter1;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,9,0,9,9>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_9,_9,_0,_9,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&m22P;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (double)&f2_19;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (double)&f2_19;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,9,0,9,9>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_9,_9,_0,_9,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[0] = (double)&m12P;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[1] = (double)&f2_19;
      pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
      array[2] = (double)&pointsCenter1;
      Eigen::internal::
      call_assignment<Eigen::Matrix<double,9,9,0,9,9>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,9,9,0,9,9>const,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>,Eigen::Matrix<double,1,9,1,1,9>,0>const>>
                ((Matrix<double,_9,_9,_0,_9,_9> *)
                 pointsCenter2.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                 m_storage.m_data.array[0],
                 (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)&pointsCenter2);
    }
    sVar17 = sVar17 + 1;
    lVar15 = lVar15 + 0x100000000;
  }
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&startingRotation);
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&startingRotation);
  lVar15 = 0;
  for (sVar17 = 0; sVar1 != sVar17; sVar17 = sVar17 + 1) {
    iVar16 = (int)sVar17;
    lVar14 = lVar15 >> 0x1e;
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[6])
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&startingRotation,adapter,
               (long)iVar13);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[2])
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&f2_19,adapter,(long)iVar13);
    Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&startingRotation;
    Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)&f2_19;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter1,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&Hcross);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[8])
              ((PlainObjectBase<Eigen::Matrix<double,3,3,0,3,3>> *)&startingRotation,adapter,
               (long)iVar13);
    if (indices->_useIndices != false) {
      iVar16 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[3])
              ((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
                *)&f2_19,adapter,(long)iVar16);
    Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
         (double *)&startingRotation;
    Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
         (Index)&f2_19;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)&pointsCenter2,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&Hcross);
    lVar15 = lVar15 + 0x100000000;
  }
  auVar2 = vcvtusi2sd_avx512f(in_ZMM5._0_16_,sVar1);
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (double)&pointsCenter1;
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = auVar2._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0],
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&startingRotation);
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (double)&pointsCenter2;
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[2] = auVar2._0_8_;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,1,0,3,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
             .m_data.array[0],
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&startingRotation);
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[0] = (double)CONCAT44(startingRotation.
                              super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                              .m_data.array[0]._4_4_,3);
  f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0]._0_4_
       = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)&Hcross,(int *)&startingRotation,(int *)&f2_19);
  startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
  array[1] = 0.0;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&Hcross,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              *)&startingRotation);
  lVar15 = 0;
  for (sVar17 = 0; sVar1 != sVar17; sVar17 = sVar17 + 1) {
    iVar16 = (int)sVar17;
    lVar14 = lVar15 >> 0x1e;
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[6])
              ((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&startingRotation,adapter,(long)iVar13);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[2])(&t1,adapter,(long)iVar13);
    auVar23 = (undefined1  [64])
              f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.
              array._0_64_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1] =
         (double)&t1;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[0] =
         (double)&startingRotation;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array.
    _24_40_ = auVar23._24_40_;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
         (double)&pointsCenter1;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&f2,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&f2_19);
    iVar13 = iVar16;
    if (indices->_useIndices != false) {
      iVar13 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[8])
              ((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&startingRotation,adapter,(long)iVar13);
    if (indices->_useIndices != false) {
      iVar16 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                              _M_impl.super__Vector_impl_data._M_start + lVar14);
    }
    (*adapter->_vptr_RelativeAdapterBase[3])(&t2,adapter,(long)iVar16);
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[1] =
         (double)&t2;
    f2_19.super_PlainObjectBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>.m_storage.m_data.array[2] =
         (double)&pointsCenter2;
    Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&t1,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&f2_19);
    startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[1] = (double)&f2;
    startingRotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
    array[0] = (double)&t1;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&Hcross,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)&startingRotation);
    lVar15 = lVar15 + 0x100000000;
  }
  math::arun(&startingRotation,&Hcross);
  math::rot2cayley((cayley_t *)&f2_19,&startingRotation);
  modules::ge_main2(&xxF,&yyF,&zzF,&xyF,&yzF,&zxF,&x1P,&y1P,&z1P,&x2P,&y2P,&z2P,&m11P,&m12P,&m22P,
                    (cayley_t *)&f2_19,output);
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[8] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[8];
  dVar21 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[1];
  dVar20 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
           .m_data.array[2];
  dVar4 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[3];
  dVar5 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[4];
  dVar6 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[5];
  dVar7 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[6];
  dVar8 = (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
          m_data.array[7];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[0] =
       (output->rotation).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
       m_data.array[0];
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[1] = dVar21;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[2] = dVar20;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[3] = dVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[4] = dVar5;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[5] = dVar6;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[6] = dVar7;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
  m_data.array[7] = dVar8;
  Eigen::internal::handmade_aligned_free
            (Hcross.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data);
  return __return_storage_ptr__;
}

Assistant:

rotation_t ge(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    geOutput_t & output,
    bool useWeights )
{ 
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 5);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();
  
  Eigen::Matrix<double,3,9> x1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> x2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z2P = Eigen::Matrix<double,3,9>::Zero();
  
  Eigen::Matrix<double,9,9> m11P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m12P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m22P = Eigen::Matrix<double,9,9>::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    //get the weight of this feature
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;
    
    //unrotate the bearing vectors
    bearingVector_t f1 = adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
    
    //compute the standard summation terms
    Eigen::Matrix3d F = f2*f2.transpose();

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
    
    //now compute the "cross"-summation terms    
    Eigen::Vector3d t1 = adapter.getCamOffset1(indices[i]);
    Eigen::Vector3d t2 = adapter.getCamOffset2(indices[i]);
    
    Eigen::Matrix<double,1,9> f2_19;
    double temp = f1[1]*t1[2]-f1[2]*t1[1];
    f2_19(0,0) = f2[0] * temp;
    f2_19(0,1) = f2[1] * temp;
    f2_19(0,2) = f2[2] * temp;
    temp = f1[2]*t1[0]-f1[0]*t1[2];
    f2_19(0,3) = f2[0] * temp;
    f2_19(0,4) = f2[1] * temp;
    f2_19(0,5) = f2[2] * temp;
    temp = f1[0]*t1[1]-f1[1]*t1[0];
    f2_19(0,6) = f2[0] * temp;
    f2_19(0,7) = f2[1] * temp;
    f2_19(0,8) = f2[2] * temp;
    
    Eigen::Matrix<double,1,9> f1_19;
    temp = f2[1]*t2[2]-f2[2]*t2[1];
    f1_19(0,0) = f1[0] * temp;
    f1_19(0,1) = f1[1] * temp;
    f1_19(0,2) = f1[2] * temp;
    temp = f2[2]*t2[0]-f2[0]*t2[2];
    f1_19(0,3) = f1[0] * temp;
    f1_19(0,4) = f1[1] * temp;
    f1_19(0,5) = f1[2] * temp;
    temp = f2[0]*t2[1]-f2[1]*t2[0];
    f1_19(0,6) = f1[0] * temp;
    f1_19(0,7) = f1[1] * temp;
    f1_19(0,8) = f1[2] * temp;
    
    if( useWeights )
    {
      x1P = x1P + ( (weight * f1[0]) * f2 ) * f1_19;
      y1P = y1P + ( (weight * f1[1]) * f2 ) * f1_19;
      z1P = z1P + ( (weight * f1[2]) * f2 ) * f1_19;
      
      x2P = x2P + ( (weight * f1[0]) * f2 ) * f2_19;
      y2P = y2P + ( (weight * f1[1]) * f2 ) * f2_19;
      z2P = z2P + ( (weight * f1[2]) * f2 ) * f2_19;
      
      m11P = m11P - ( weight * f1_19.transpose() ) * f1_19;
      m22P = m22P - ( weight * f2_19.transpose() ) * f2_19;
      m12P = m12P - ( weight * f2_19.transpose() ) * f1_19;
    }
    else
    {
      x1P = x1P + ( f1[0] * f2 ) * f1_19;
      y1P = y1P + ( f1[1] * f2 ) * f1_19;
      z1P = z1P + ( f1[2] * f2 ) * f1_19;
      
      x2P = x2P + ( f1[0]) * f2 * f2_19;
      y2P = y2P + ( f1[1]) * f2 * f2_19;
      z2P = z2P + ( f1[2]) * f2 * f2_19;
      
      m11P = m11P - f1_19.transpose() * f1_19;
      m22P = m22P - f2_19.transpose() * f2_19;
      m12P = m12P - f2_19.transpose() * f1_19;
    }
  }

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f =      adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  rotation_t startingRotation = math::arun(Hcross);

  //Do minimization
  modules::ge_main2(
      xxF, yyF, zzF, xyF, yzF, zxF,
      x1P, y1P, z1P, x2P, y2P, z2P,
      m11P, m12P, m22P, math::rot2cayley(startingRotation), output);

  return output.rotation;
}